

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void minLiterals(void)

{
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int v;
  int l;
  int g;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  int iVar1;
  int local_8;
  int local_4;
  
  if (isSat == 0) {
    groupSize = 4;
    if (numOfVariables == 1) {
      numOfVariables = 2;
    }
    groups = (numOfVariables + 2) / 4;
    numOfVariables = groups * 4 + 1;
    permute = (int *)malloc((long)(groups * 4 + 2) << 2);
    unpermute = (int *)malloc((long)(numOfVariables + 1) << 2);
    idpermute = (int *)malloc((long)(numOfVariables + 1) << 2);
    for (iVar1 = 1; iVar1 <= numOfVariables; iVar1 = iVar1 + 1) {
      idpermute[iVar1] = iVar1;
    }
    heading(0);
    initGlobalPermute();
    setPlainPermute();
    for (local_4 = 0; local_4 < groups + -1; local_4 = local_4 + 1) {
      mainUnsatGroup(local_4,-1);
    }
    lastUnsatGroup(iVar1);
    setAnnealingPermute();
    for (local_4 = 0; local_4 < groups + -1; local_4 = local_4 + 1) {
      mainUnsatGroup(local_4,1);
    }
    lastUnsatGroup(iVar1);
  }
  else {
    groupSize = 5;
    numOfVariables = ((numOfVariables + -1) / 5 + 1) * 5;
    groups = numOfVariables / 5;
    initModel(in_stack_fffffffffffffff4);
    idpermute = (int *)malloc((long)(numOfVariables + 1) << 2);
    permute = (int *)malloc((long)(numOfVariables + 1) << 2);
    unpermute = (int *)malloc((long)(numOfVariables + 1) << 2);
    permute1 = (int *)malloc((long)(numOfVariables + 1) << 2);
    unpermute1 = (int *)malloc((long)(numOfVariables + 1) << 2);
    heading(0);
    for (iVar1 = 1; iVar1 <= numOfVariables; iVar1 = iVar1 + 1) {
      idpermute[iVar1] = iVar1;
    }
    initGlobalPermute();
    setPlainPermute();
    for (local_4 = 0; local_4 < groups; local_4 = local_4 + 1) {
      firstSatGroup(iVar1,in_stack_fffffffffffffff0);
    }
    for (local_8 = 0; local_8 < 2; local_8 = local_8 + 1) {
      setAnnealingPermute1(unaff_retaddr_00);
      secondSatGroup(local_8,1);
      if (local_8 == 0) {
        for (iVar1 = 1; iVar1 <= numOfVariables; iVar1 = iVar1 + 1) {
          permute1[iVar1] = permute[iVar1];
          unpermute1[iVar1] = unpermute[iVar1];
        }
        initChums();
      }
    }
    if (*stringOptions != (char *)0x0) {
      printModel((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    }
  }
  return;
}

Assistant:

void minLiterals ()
{
    int g,l,v;

    if (isSat)
    {
        groupSize = 5;
        numOfVariables = ((numOfVariables-1)/groupSize + 1) * groupSize;
        groups = numOfVariables/groupSize;
        initModel(numOfVariables);
        idpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        permute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        unpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
         permute1 = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
         unpermute1 = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        heading(numOfVariables);
       for (v=1;v<=numOfVariables;v++)
           idpermute[v] = v;

        initGlobalPermute();
        setPlainPermute();
        for (g=0;g<groups;g++)
            firstSatGroup (g, -1);


        for (l=0;l<2;l++)
        {
            setAnnealingPermute1(l);
            secondSatGroup(l, 1);
            if (l==0)
            {
                for (v=1;v<=numOfVariables;v++)
                {
                    permute1[v] = permute[v];
                    unpermute1[v] = unpermute[v];
                }
				initChums();
            }
        }
        if (stringOptions[MODEL] != NULL)
            printModel (stringOptions[MODEL]);
    }
    else
    {
        groupSize = 4;
        if (numOfVariables == 1)
            numOfVariables = 2;
        groups = (numOfVariables+2)/groupSize;
        numOfVariables = groupSize*groups + 1;
        permute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        unpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        idpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        for (v=1;v<=numOfVariables;v++)
        {
            idpermute[v] = v;
        }
        heading(numOfVariables);


        initGlobalPermute();
        setPlainPermute();
        for (g=0;g<groups-1;g++)
            mainUnsatGroup (g,-1);
        lastUnsatGroup (-1);
        setAnnealingPermute();
        for (g=0;g<groups-1;g++)
            mainUnsatGroup (g,1);
        lastUnsatGroup (1);
    }
}